

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

void __thiscall QMakeEvaluator::updateMkspecPaths(QMakeEvaluator *this)

{
  QMakeGlobals *pQVar1;
  long lVar2;
  QString *it;
  QStringList *pQVar3;
  long in_FS_OFFSET;
  ProKey local_168;
  ProString local_138;
  QStringBuilder<ProString,_const_QString_&> local_108;
  QArrayDataPointer<char16_t> local_d0;
  QLatin1StringView local_b8;
  QArrayDataPointer<QString> local_a8;
  QLatin1StringView local_88;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x0;
  local_58.size = 0;
  local_78.size = -0x5555555555555556;
  local_78.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_78.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QLatin1String::QLatin1String(&local_88,"/mkspecs");
  QString::QString((QString *)&local_78,local_88);
  local_a8.size = -0x5555555555555556;
  local_a8.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_a8.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
  pQVar1 = this->m_option;
  QLatin1String::QLatin1String(&local_b8,"QMAKEPATH");
  QString::QString((QString *)&local_108,local_b8);
  QMakeGlobals::getPathListEnv((QStringList *)&local_a8,pQVar1,(QString *)&local_108);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
  pQVar3 = (QStringList *)local_a8.ptr;
  for (lVar2 = local_a8.size * 0x18; lVar2 != 0; lVar2 = lVar2 + -0x18) {
    local_138.m_string.d.d = (Data *)pQVar3;
    local_138.m_string.d.ptr = (char16_t *)&local_78;
    QStringBuilder<const_QString_&,_const_QString_&>::convertTo<QString>
              ((QString *)&local_108,(QStringBuilder<const_QString_&,_const_QString_&> *)&local_138)
    ;
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)&local_108);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
    pQVar3 = pQVar3 + 1;
  }
  pQVar3 = (QStringList *)(this->m_qmakepath).d.ptr;
  for (lVar2 = (this->m_qmakepath).d.size * 0x18; lVar2 != 0; lVar2 = lVar2 + -0x18) {
    local_138.m_string.d.d = (Data *)pQVar3;
    local_138.m_string.d.ptr = (char16_t *)&local_78;
    QStringBuilder<const_QString_&,_const_QString_&>::convertTo<QString>
              ((QString *)&local_108,(QStringBuilder<const_QString_&,_const_QString_&> *)&local_138)
    ;
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)&local_108);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
    pQVar3 = pQVar3 + 1;
  }
  if ((this->m_buildRoot).d.size != 0) {
    local_138.m_string.d.d = (Data *)&this->m_buildRoot;
    local_138.m_string.d.ptr = (char16_t *)&local_78;
    QStringBuilder<QString_&,_const_QString_&>::convertTo<QString>
              ((QString *)&local_108,(QStringBuilder<QString_&,_const_QString_&> *)&local_138);
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)&local_108);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
  }
  if ((this->m_sourceRoot).d.size != 0) {
    local_138.m_string.d.d = (Data *)&this->m_sourceRoot;
    local_138.m_string.d.ptr = (char16_t *)&local_78;
    QStringBuilder<QString_&,_const_QString_&>::convertTo<QString>
              ((QString *)&local_108,(QStringBuilder<QString_&,_const_QString_&> *)&local_138);
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)&local_108);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
  }
  pQVar1 = this->m_option;
  ProKey::ProKey(&local_168,"QT_HOST_DATA/get");
  QMakeGlobals::propertyValue(&local_138,pQVar1,&local_168);
  ProString::ProString(&local_108.a,&local_138);
  local_108.b = (QString *)&local_78;
  QStringBuilder<ProString,_const_QString_&>::convertTo<QString>((QString *)&local_d0,&local_108);
  QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)&local_d0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_138);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
  pQVar1 = this->m_option;
  ProKey::ProKey(&local_168,"QT_HOST_DATA/src");
  QMakeGlobals::propertyValue(&local_138,pQVar1,&local_168);
  ProString::ProString(&local_108.a,&local_138);
  local_108.b = (QString *)&local_78;
  QStringBuilder<ProString,_const_QString_&>::convertTo<QString>((QString *)&local_d0,&local_108);
  QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)&local_d0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_138);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
  QtPrivate::QStringList_removeDuplicates((QList *)&local_58);
  QArrayDataPointer<QString>::operator=(&(this->m_mkspecPaths).d,&local_58);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeEvaluator::updateMkspecPaths()
{
    QStringList ret;
    const QString concat = QLatin1String("/mkspecs");

    const auto paths = m_option->getPathListEnv(QLatin1String("QMAKEPATH"));
    for (const QString &it : paths)
        ret << it + concat;

    for (const QString &it : std::as_const(m_qmakepath))
        ret << it + concat;

    if (!m_buildRoot.isEmpty())
        ret << m_buildRoot + concat;
    if (!m_sourceRoot.isEmpty())
        ret << m_sourceRoot + concat;

    ret << m_option->propertyValue(ProKey("QT_HOST_DATA/get")) + concat;
    ret << m_option->propertyValue(ProKey("QT_HOST_DATA/src")) + concat;

    ret.removeDuplicates();
    m_mkspecPaths = ret;
}